

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.c
# Opt level: O3

int get_bit_index(CB_Code opcode)

{
  CB_Code CVar1;
  CB_Code CVar2;
  uint uVar3;
  
  CVar1 = opcode & CB_Code_SET_6_B;
  CVar2 = opcode & CB_Code_BIT_6_B;
  uVar3 = 0;
  if ((CVar2 != CB_Code_BIT_0_B && CVar1 != CB_Code_RES_0_B) &&
     (uVar3 = 2, CVar2 != CB_Code_BIT_2_B && CVar1 != CB_Code_RES_2_B)) {
    uVar3 = 4;
    if (CVar2 != CB_Code_BIT_4_B) {
      uVar3 = (CVar1 != CB_Code_RES_4_B) + 4 + (uint)(CVar1 != CB_Code_RES_4_B);
    }
  }
  return opcode >> 3 & 1 | uVar3;
}

Assistant:

int get_bit_index(CB_Code opcode) {
    
    uint8_t lower = (uint8_t)(opcode) & 0x0F;
    int column_index = lower <= 0x07 ? 0 : 1;

    uint8_t upper = (uint8_t) (opcode) & 0xF0;

    int row_index = 6;
    if(upper == 0x40 || upper == 0x80 || upper == 0xC0) {
        row_index = 0;
    } else if(upper == 0x50 || upper == 0x90 || upper == 0xD0) {
        row_index = 2;
    } else if(upper == 0x60 || upper == 0xA0 || upper == 0xE0) {
        row_index = 4;
    }  

    return column_index + row_index;
}